

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O2

vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_> *
sisl::tp_linear::get_integer_support<3>(void)

{
  pointer pMVar1;
  Scalar *pSVar2;
  vector<Eigen::Matrix<int,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<int,_1,1,0,_1,1>>> *in_RDI;
  DenseStorage<int,__1,__1,_1,_0> *other;
  long index;
  lattice_site po;
  lattice_site zero;
  Matrix<int,__1,_1,_0,__1,_1> l;
  Matrix<int,__1,_1,_0,__1,_1> local_b0;
  long local_a0;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_98;
  void *local_78 [2];
  Matrix<int,__1,_1,_0,__1,_1> local_68;
  DenseStorage<int,__1,__1,_1,_0> local_58;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_48;
  
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_98.
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  local_98.
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_lhs._0_4_ = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_68,(int *)&local_48);
  local_48.m_lhs._0_4_ = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_b0,(int *)&local_48);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_68);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_b0);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::push_back(&local_98,&local_68);
  index = 0;
  while (index != 3) {
    std::
    vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
    ::clear((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             *)in_RDI);
    local_a0 = index;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_b0,index);
    pMVar1 = local_98.
             super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *pSVar2 = 1;
    for (other = (DenseStorage<int,__1,__1,_1,_0> *)
                 local_98.
                 super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        other != (DenseStorage<int,__1,__1,_1,_0> *)pMVar1; other = other + 1) {
      Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage(&local_58,other);
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                (&local_48,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_58,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_b0);
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_78,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      std::vector<Eigen::Matrix<int,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<int,-1,1,0,-1,1>>>::
      emplace_back<Eigen::Matrix<int,_1,1,0,_1,1>>(in_RDI,(Matrix<int,__1,_1,_0,__1,_1> *)local_78);
      free(local_78[0]);
      std::
      vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                   *)in_RDI,(value_type *)&local_58);
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)&local_48,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_58,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_b0);
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_78,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      std::vector<Eigen::Matrix<int,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<int,-1,1,0,-1,1>>>::
      emplace_back<Eigen::Matrix<int,_1,1,0,_1,1>>(in_RDI,(Matrix<int,__1,_1,_0,__1,_1> *)local_78);
      free(local_78[0]);
      free(local_58.m_data);
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_b0,
                        local_a0);
    *pSVar2 = 0;
    std::
    vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
    ::operator=(&local_98,
                (vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                 *)in_RDI);
    index = local_a0 + 1;
  }
  free(local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_68.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_98);
  return (vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
          *)in_RDI;
}

Assistant:

static std::vector<lattice_site> get_integer_support() {
            // Poor man's cartesian product :x
            std::vector<lattice_site> ret = {}, tret = {};
            lattice_site zero(N), po(N);
            zero.setZero();
            po.setZero();
            tret.push_back(zero);

            for(int i = 0; i < N; i++) {
                ret.clear();
                po[i] = 1;
                for(auto l : tret) {
                    ret.push_back(l + po);
                    ret.push_back(l);
                    ret.push_back(l - po);
                }
                po[i] = 0;
                tret = ret;
            }
            return ret;
        }